

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)74,unsigned_short,CPU::MC68000::ProcessorBase>
               (uint32_t source,unsigned_short *destination,Status *status,
               ProcessorBase *flow_controller)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar3 + 1;
  if (uVar3 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
    uVar2 = (uint)*destination;
  }
  else {
    if (uVar3 < 0x11) {
      uVar1 = *destination;
      uVar4 = (ulong)((uVar1 >> (uVar3 - 1 & 0x1f) & 1) != 0);
      status->extend_flag = uVar4;
      status->carry_flag = uVar4;
      status->overflow_flag = 0;
      uVar2 = (uint)(int)(short)uVar1 >> 0xf;
      if (uVar3 != 0x10) {
        uVar2 = uVar2 << (0x10 - (byte)uVar3 & 0x1f) | (uint)(uVar1 >> ((byte)uVar3 & 0x1f));
      }
    }
    else {
      status->carry_flag = 0;
      status->extend_flag = 0;
      status->overflow_flag = 0;
      uVar2 = (uint)(int)(short)*destination >> 0xf;
    }
    *destination = (unsigned_short)uVar2;
  }
  status->zero_result = (ulong)(uVar2 & 0xffff);
  status->negative_flag = (ulong)(uVar2 & 0x8000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}